

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

void __thiscall Translator::visit(Translator *this,FunctionListNode *functionListNode)

{
  if (functionListNode->next != (FunctionListNode *)0x0) {
    visit(this,functionListNode->next);
  }
  if (functionListNode->function != (FunctionNode *)0x0) {
    visit(this,functionListNode->function);
    return;
  }
  return;
}

Assistant:

void Translator::visit(FunctionListNode *functionListNode) {
    if (functionListNode->getNext() != nullptr) {
        functionListNode->getNext()->accept(this);
    }
    if (functionListNode->getFunction() != nullptr) {
        functionListNode->getFunction()->accept(this);
    }
}